

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUVProcessChain.cxx
# Opt level: O0

cmUVProcessChainBuilder * __thiscall
cmUVProcessChainBuilder::SetExternalStream(cmUVProcessChainBuilder *this,Stream stdio,FILE *stream)

{
  int fd_00;
  int fd;
  FILE *stream_local;
  Stream stdio_local;
  cmUVProcessChainBuilder *this_local;
  
  fd_00 = cm_fileno(stream);
  if (fd_00 < 0) {
    this_local = SetNoStream(this,stdio);
  }
  else {
    this_local = SetExternalStream(this,stdio,fd_00);
  }
  return this_local;
}

Assistant:

cmUVProcessChainBuilder& cmUVProcessChainBuilder::SetExternalStream(
  Stream stdio, FILE* stream)
{
  int fd = cm_fileno(stream);
  if (fd >= 0) {
    return this->SetExternalStream(stdio, fd);
  }
  return this->SetNoStream(stdio);
}